

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O0

void * __thiscall
google::protobuf::internal::ExtensionSet::MutableRawRepeatedField(ExtensionSet *this,int number)

{
  bool bVar1;
  LogMessage *pLVar2;
  pointer ppVar3;
  LogFinisher local_85 [20];
  byte local_71;
  LogMessage local_70;
  iterator local_38;
  _Rb_tree_const_iterator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>
  local_30;
  iterator local_28;
  _Rb_tree_const_iterator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>
  local_20;
  const_iterator iter;
  int number_local;
  ExtensionSet *this_local;
  
  iter._M_node._4_4_ = number;
  local_28._M_node =
       (_Base_ptr)
       std::
       map<int,_google::protobuf::internal::ExtensionSet::Extension,_std::less<int>,_std::allocator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>_>
       ::find(&this->extensions_,(key_type *)((long)&iter._M_node + 4));
  std::
  _Rb_tree_const_iterator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>
  ::_Rb_tree_const_iterator(&local_20,&local_28);
  local_38._M_node =
       (_Base_ptr)
       std::
       map<int,_google::protobuf::internal::ExtensionSet::Extension,_std::less<int>,_std::allocator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>_>
       ::end(&this->extensions_);
  std::
  _Rb_tree_const_iterator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>
  ::_Rb_tree_const_iterator(&local_30,&local_38);
  bVar1 = std::operator!=(&local_20,&local_30);
  local_71 = 0;
  if (!bVar1) {
    LogMessage::LogMessage
              (&local_70,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/chai2010[P]protorpc/src/google/protobuf/extension_set.cc"
               ,0x137);
    local_71 = 1;
    pLVar2 = LogMessage::operator<<(&local_70,"CHECK failed: iter != extensions_.end(): ");
    pLVar2 = LogMessage::operator<<(pLVar2,"no extension numbered ");
    pLVar2 = LogMessage::operator<<(pLVar2,iter._M_node._4_4_);
    LogFinisher::operator=(local_85,pLVar2);
  }
  if ((local_71 & 1) != 0) {
    LogMessage::~LogMessage(&local_70);
  }
  ppVar3 = std::
           _Rb_tree_const_iterator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>
           ::operator->(&local_20);
  return (void *)(ppVar3->second).field_0.int64_value;
}

Assistant:

void* ExtensionSet::MutableRawRepeatedField(int number) {
  // We assume that all the RepeatedField<>* pointers have the same
  // size and alignment within the anonymous union in Extension.
  map<int, Extension>::const_iterator iter = extensions_.find(number);
  GOOGLE_CHECK(iter != extensions_.end()) << "no extension numbered " << number;
  return iter->second.repeated_int32_value;
}